

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O1

bool basist::pack_astc_block(uint32_t *pDst,astc_block_desc *pBlock,uint32_t uastc_mode)

{
  byte bVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  byte bVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  uint8_t *puVar9;
  ulong uVar10;
  byte *pbVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  bool bVar15;
  uint32_t temp [5];
  uint local_ac;
  byte local_a8 [8];
  int local_a0;
  int local_9c;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  ulong local_88;
  ulong uStack_80;
  undefined4 local_78;
  uint local_74 [3];
  ulong local_68;
  ulong local_60;
  ulong *local_58;
  ulong local_50;
  uint8_t *local_48;
  ulong local_40;
  ulong local_38;
  
  if (0x12 < uastc_mode) {
    __assert_fail("uastc_mode < TOTAL_UASTC_MODES",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                  ,0x2e73,
                  "bool basist::pack_astc_block(uint32_t *, const astc_block_desc *, uint32_t)");
  }
  bVar15 = pBlock->m_dual_plane;
  uVar2 = *(undefined4 *)(g_uastc_mode_astc_block_mode + (ulong)uastc_mode * 4);
  *(char *)pDst = (char)uVar2;
  bVar5 = (byte)((uint)uVar2 >> 8);
  *(byte *)((long)pDst + 1) = bVar5;
  *(undefined8 *)((long)pDst + 2) = 0;
  pDst[2] = 0;
  pDst[3] = 0;
  if ((*(int *)(g_astc_bise_range_table + (long)pBlock->m_weight_range * 0xc + 4) != 0) ||
     (lVar8 = (long)pBlock->m_weight_range * 0xc, *(int *)(g_astc_bise_range_table + lVar8 + 8) != 0
     )) {
    __assert_fail("!g_astc_bise_range_table[pBlock->m_weight_range][1] && !g_astc_bise_range_table[pBlock->m_weight_range][2]"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                  ,0x2e82,
                  "bool basist::pack_astc_block(uint32_t *, const astc_block_desc *, uint32_t)");
  }
  uVar14 = *(uint *)(g_astc_bise_range_table + lVar8);
  bVar5 = (char)pBlock->m_subsets * '\b' - 8U | bVar5;
  *(byte *)((long)pDst + 1) = bVar5;
  if (pBlock->m_subsets == 1) {
    uVar13 = pBlock->m_cem;
    *(byte *)((long)pDst + 1) = bVar5 | (byte)(uVar13 << 5);
    *(byte *)((long)pDst + 2) = *(byte *)((long)pDst + 2) | (byte)(uVar13 >> 3);
    local_ac = 0x11;
  }
  else {
    uVar13 = pBlock->m_partition_seed;
    iVar3 = 10;
    uVar6 = 0xd;
    do {
      iVar4 = 8 - (uVar6 & 7);
      if (iVar3 < iVar4) {
        iVar4 = iVar3;
      }
      local_ac = iVar4 + uVar6;
      pbVar11 = (byte *)((long)pDst + (long)((int)uVar6 >> 3));
      *pbVar11 = *pbVar11 | (byte)(uVar13 << (sbyte)(uVar6 & 7));
      uVar13 = uVar13 >> ((byte)iVar4 & 0x1f);
      iVar3 = iVar3 - iVar4;
      uVar6 = local_ac;
    } while (iVar3 != 0);
    iVar3 = ((pBlock->m_cem & 0xfU) << 2) << (sbyte)(local_ac & 7);
    pbVar11 = (byte *)((long)pDst + (ulong)(uint)((int)local_ac >> 3));
    *pbVar11 = *pbVar11 | (byte)iVar3;
    if (2 < (local_ac & 7)) {
      pbVar11 = (byte *)((long)pDst + (ulong)(((int)local_ac >> 3) + 1));
      *pbVar11 = *pbVar11 | (byte)((uint)iVar3 >> 8);
    }
    local_ac = local_ac + 6;
  }
  if (pBlock->m_dual_plane == true) {
    iVar3 = uVar14 << (bVar15 + 4U & 0x1f);
    if (0x48 < iVar3 - 0x18U) {
      __assert_fail("(total_weight_bits >= 24) && (total_weight_bits <= 96)",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                    ,0x2e99,
                    "bool basist::pack_astc_block(uint32_t *, const astc_block_desc *, uint32_t)");
    }
    pbVar11 = (byte *)((long)pDst + (ulong)(0x78U - iVar3 >> 3));
    *pbVar11 = *pbVar11 | (char)pBlock->m_ccs << 6;
  }
  iVar3 = ((pBlock->m_cem >> 2) + 1) * pBlock->m_subsets;
  if (9 < iVar3) {
    __assert_fail("num_cem_pairs <= 9",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                  ,0x2ea0,
                  "bool basist::pack_astc_block(uint32_t *, const astc_block_desc *, uint32_t)");
  }
  local_60 = (ulong)uVar14;
  uVar10 = (ulong)(byte)g_uastc_mode_endpoint_ranges[uastc_mode];
  local_88 = 0;
  uStack_80 = 0;
  local_78 = 0;
  local_9c = *(int *)(g_astc_bise_range_table + uVar10 * 0xc + 4);
  local_58 = (ulong *)pDst;
  local_68 = (ulong)bVar15;
  if (local_9c == 0) {
    bVar15 = *(int *)(g_astc_bise_range_table + uVar10 * 0xc + 8) == 0;
    uVar14 = (uint)!bVar15 * 3;
  }
  else {
    uVar14 = 5;
    bVar15 = false;
  }
  uVar6 = iVar3 * 2;
  uVar13 = *(uint *)(g_astc_bise_range_table + uVar10 * 0xc);
  if (bVar15) {
    if (0 < iVar3) {
      if (9 < uVar13) {
        __assert_fail("codesize <= 9",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                      ,0x2dac,
                      "void basist::astc_set_bits_1_to_9(uint32_t *, int &, uint32_t, uint32_t)");
      }
      uVar10 = 0;
      do {
        if (uVar13 != 0) {
          iVar3 = (uint)pBlock->m_endpoints[uVar10] << (sbyte)(local_ac & 7);
          pbVar11 = (byte *)((long)&local_88 + (ulong)(uint)((int)local_ac >> 3));
          *pbVar11 = *pbVar11 | (byte)iVar3;
          if (8 - (local_ac & 7) < uVar13) {
            pbVar11 = (byte *)((long)&local_88 + (ulong)(((int)local_ac >> 3) + 1));
            *pbVar11 = *pbVar11 | (byte)((uint)iVar3 >> 8);
          }
        }
        uVar10 = uVar10 + 1;
        local_ac = local_ac + uVar13;
      } while (uVar6 != uVar10);
    }
  }
  else {
    local_48 = pBlock->m_endpoints;
    local_38 = (ulong)uVar6;
    uVar10 = (long)(int)(uVar6 + (uint)(local_9c != 0) * 2 + 2) /
             (long)(int)((uint)(local_9c != 0) * 2 + 3);
    if (0 < (int)uVar10) {
      bVar5 = (byte)uVar13;
      local_a0 = uVar13 * 3 + 7;
      local_8c = uVar13 + 3;
      local_90 = uVar13 * 2 + 3;
      local_94 = uVar13 * 2 + 5;
      local_98 = uVar13 * 3 + 5;
      local_50 = (ulong)uVar14;
      local_40 = uVar10 & 0xffffffff;
      uVar10 = 0;
      do {
        local_a8[4] = 0;
        local_a8[0] = 0;
        local_a8[1] = 0;
        local_a8[2] = 0;
        local_a8[3] = 0;
        uVar6 = (int)local_38 - uVar14 * (int)uVar10;
        uVar7 = uVar6;
        if ((int)uVar14 < (int)uVar6) {
          uVar7 = uVar14;
        }
        if (0 < (int)uVar7) {
          if ((int)uVar14 < (int)uVar6) {
            uVar6 = uVar14;
          }
          memcpy(local_a8,local_48 + uVar10 * local_50,(ulong)uVar6);
        }
        if (local_9c == 0) {
          lVar8 = 0;
          pbVar11 = local_a8;
          iVar3 = 0;
          do {
            iVar3 = iVar3 + (uint)(*pbVar11 >> (bVar5 & 0x1f)) *
                            *(int *)((long)&astc_encode_quints(unsigned_int*,unsigned_char_const*,int&,int)
                                            ::s_muls + lVar8);
            *(uint *)((long)local_74 + lVar8) = (uint)*pbVar11 & ~(-1 << (bVar5 & 0x1f));
            lVar8 = lVar8 + 4;
            pbVar11 = pbVar11 + 1;
          } while (lVar8 != 0xc);
          if (0x7c < iVar3) {
            __assert_fail("quints < 125",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                          ,0x2e37,
                          "void basist::astc_encode_quints(uint32_t *, const uint8_t *, int &, int)"
                         );
          }
          if (local_a0 != 0) {
            bVar1 = g_astc_quint_encode[iVar3];
            uVar7 = (bVar1 >> 5 & 3) << ((byte)local_98 & 0x1f) |
                    local_74[2] << ((byte)local_94 & 0x1f) |
                    (bVar1 >> 3 & 3) << ((byte)local_90 & 0x1f) |
                    local_74[1] << ((byte)local_8c & 0x1f) |
                    (bVar1 & 7) << (bVar5 & 0x1f) | local_74[0];
            uVar6 = local_ac;
            iVar3 = local_a0;
            do {
              iVar4 = 8 - (uVar6 & 7);
              if (iVar3 < iVar4) {
                iVar4 = iVar3;
              }
              local_ac = iVar4 + uVar6;
              pbVar11 = (byte *)((long)&local_88 + (long)((int)uVar6 >> 3));
              *pbVar11 = *pbVar11 | (byte)(uVar7 << (sbyte)(uVar6 & 7));
              uVar7 = uVar7 >> ((byte)iVar4 & 0x1f);
              iVar3 = iVar3 - iVar4;
              uVar6 = local_ac;
            } while (iVar3 != 0);
          }
        }
        else {
          astc_encode_trits((uint32_t *)&local_88,local_a8,(int *)&local_ac,uVar13);
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 != local_40);
    }
  }
  *local_58 = *local_58 | local_88;
  local_58[1] = local_58[1] | uStack_80;
  if (4 < (int)local_60 - 1U) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                  ,0x2ef0,
                  "bool basist::pack_astc_block(uint32_t *, const astc_block_desc *, uint32_t)");
  }
  uVar14 = (int)local_68 * 0x10 + 0x10;
  switch((int)local_60) {
  case 1:
    puVar9 = pBlock->m_weights;
    uVar10 = 0x7f;
    do {
      pbVar11 = (byte *)((long)local_58 + (uVar10 >> 3));
      *pbVar11 = *pbVar11 | *puVar9 << ((byte)uVar10 & 7);
      puVar9 = puVar9 + 1;
      lVar8 = uVar14 + uVar10;
      uVar10 = uVar10 - 1;
    } while (lVar8 != 0x80);
    break;
  case 2:
    uVar10 = 0x7e;
    uVar12 = 0;
    do {
      pbVar11 = (byte *)((long)local_58 + (uVar10 >> 3));
      *pbVar11 = *pbVar11 | ""[pBlock->m_weights[uVar12]] << ((byte)uVar10 & 6);
      uVar12 = uVar12 + 1;
      uVar10 = uVar10 - 2;
    } while (uVar14 != uVar12);
    break;
  case 3:
    puVar9 = pBlock->m_weights;
    uVar10 = 0x7d;
    do {
      iVar3 = (uint)""[*puVar9] << ((byte)uVar10 & 7);
      if (uVar10 == 0xffffffffffffffff) {
        __assert_fail("index < 16",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                      ,0x2ec9,
                      "bool basist::pack_astc_block(uint32_t *, const astc_block_desc *, uint32_t)")
        ;
      }
      uVar12 = uVar10 >> 3 & 0x1fffffff;
      pbVar11 = (byte *)((long)local_58 + uVar12);
      *pbVar11 = *pbVar11 | (byte)iVar3;
      if (uVar10 < 0x78) {
        pbVar11 = (byte *)((long)local_58 + uVar12 + 1);
        *pbVar11 = *pbVar11 | (byte)((uint)iVar3 >> 8);
      }
      puVar9 = puVar9 + 1;
      lVar8 = (ulong)uVar14 * 3 + uVar10;
      uVar10 = uVar10 - 3;
    } while (lVar8 != 0x80);
    break;
  case 4:
    puVar9 = pBlock->m_weights;
    iVar3 = 0x7c;
    uVar10 = 0;
    do {
      if ((0x7c < (long)uVar10) || (0xf < iVar3 >> 3)) {
        __assert_fail("ofs >= 0 && (ofs >> 3) < 16",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                      ,0x2ed7,
                      "bool basist::pack_astc_block(uint32_t *, const astc_block_desc *, uint32_t)")
        ;
      }
      pbVar11 = (byte *)((long)local_58 + (ulong)(uint)(iVar3 >> 3));
      *pbVar11 = *pbVar11 | ""[*puVar9] << ((byte)iVar3 & 4);
      uVar10 = uVar10 + 4;
      iVar3 = iVar3 + -4;
      puVar9 = puVar9 + 1;
    } while (uVar14 * 4 != uVar10);
    break;
  case 5:
    puVar9 = pBlock->m_weights;
    uVar10 = 0x7b;
    do {
      iVar3 = (uint)""[*puVar9] << ((byte)uVar10 & 7);
      if (uVar10 == 0xfffffffffffffffe) {
        __assert_fail("index < 16",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                      ,0x2ee7,
                      "bool basist::pack_astc_block(uint32_t *, const astc_block_desc *, uint32_t)")
        ;
      }
      uVar12 = uVar10 >> 3 & 0x1fffffff;
      pbVar11 = (byte *)((long)local_58 + uVar12);
      *pbVar11 = *pbVar11 | (byte)iVar3;
      if (uVar10 < 0x78) {
        pbVar11 = (byte *)((long)local_58 + uVar12 + 1);
        *pbVar11 = *pbVar11 | (byte)((uint)iVar3 >> 8);
      }
      puVar9 = puVar9 + 1;
      lVar8 = (ulong)uVar14 * 5 + uVar10;
      uVar10 = uVar10 - 5;
    } while (lVar8 != 0x80);
  }
  return true;
}

Assistant:

bool pack_astc_block(uint32_t* pDst, const astc_block_desc* pBlock, uint32_t uastc_mode)
	{
		assert(uastc_mode < TOTAL_UASTC_MODES);
		uint8_t* pDst_bytes = reinterpret_cast<uint8_t*>(pDst);

		const int total_weights = pBlock->m_dual_plane ? 32 : 16;

		// Set mode bits - see Table 146-147
		uint32_t mode = g_uastc_mode_astc_block_mode[uastc_mode];
		pDst_bytes[0] = (uint8_t)mode;
		pDst_bytes[1] = (uint8_t)(mode >> 8);

		memset(pDst_bytes + 2, 0, 16 - 2);

		int bit_pos = ASTC_BLOCK_MODE_BITS;

		// We only support 1-5 bit weight indices
		assert(!g_astc_bise_range_table[pBlock->m_weight_range][1] && !g_astc_bise_range_table[pBlock->m_weight_range][2]);
		const int bits_per_weight = g_astc_bise_range_table[pBlock->m_weight_range][0];

		// See table 143 - PART
		astc_set_bits_1_to_9(pDst, bit_pos, pBlock->m_subsets - 1, ASTC_PART_BITS);

		if (pBlock->m_subsets == 1)
			astc_set_bits_1_to_9(pDst, bit_pos, pBlock->m_cem, ASTC_CEM_BITS);
		else
		{
			// See table 145
			astc_set_bits(pDst, bit_pos, pBlock->m_partition_seed, ASTC_PARTITION_INDEX_BITS);

			// Table 150 - we assume all CEM's are equal, so write 2 0's along with the CEM
			astc_set_bits_1_to_9(pDst, bit_pos, (pBlock->m_cem << 2) & 63, ASTC_CEM_BITS + 2);
		}

		if (pBlock->m_dual_plane)
		{
			const int total_weight_bits = total_weights * bits_per_weight;

			// See Illegal Encodings 23.24
			// https://www.khronos.org/registry/DataFormat/specs/1.3/dataformat.1.3.inline.html#_illegal_encodings
			assert((total_weight_bits >= 24) && (total_weight_bits <= 96));

			int ccs_bit_pos = 128 - total_weight_bits - ASTC_CCS_BITS;
			astc_set_bits_1_to_9(pDst, ccs_bit_pos, pBlock->m_ccs, ASTC_CCS_BITS);
		}

		const int num_cem_pairs = (1 + (pBlock->m_cem >> 2)) * pBlock->m_subsets;
		assert(num_cem_pairs <= 9);

		astc_pack_bise(pDst, pBlock->m_endpoints, bit_pos, num_cem_pairs * 2, g_uastc_mode_endpoint_ranges[uastc_mode]);

		// Write the weight bits in reverse bit order.
		switch (bits_per_weight)
		{
		case 1:
		{
			const uint32_t N = 1;
			for (int i = 0; i < total_weights; i++)
			{
				const uint32_t ofs = 128 - N - i;
				assert((ofs >> 3) < 16);
				pDst_bytes[ofs >> 3] |= (pBlock->m_weights[i] << (ofs & 7));
			}
			break;
		}
		case 2:
		{
			const uint32_t N = 2;
			for (int i = 0; i < total_weights; i++)
			{
				static const uint8_t s_reverse_bits2[4] = { 0, 2, 1, 3 };
				const uint32_t ofs = 128 - N - (i * N);
				assert((ofs >> 3) < 16);
				pDst_bytes[ofs >> 3] |= (s_reverse_bits2[pBlock->m_weights[i]] << (ofs & 7));
			}
			break;
		}
		case 3:
		{
			const uint32_t N = 3;
			for (int i = 0; i < total_weights; i++)
			{
				static const uint8_t s_reverse_bits3[8] = { 0, 4, 2, 6, 1, 5, 3, 7 };

				const uint32_t ofs = 128 - N - (i * N);
				const uint32_t rev = s_reverse_bits3[pBlock->m_weights[i]] << (ofs & 7);

				uint32_t index = ofs >> 3;
				assert(index < 16);
				pDst_bytes[index++] |= rev & 0xFF;
				if (index < 16)
					pDst_bytes[index++] |= (rev >> 8);
			}
			break;
		}
		case 4:
		{
			const uint32_t N = 4;
			for (int i = 0; i < total_weights; i++)
			{
				static const uint8_t s_reverse_bits4[16] = { 0, 8, 4, 12, 2, 10, 6, 14, 1, 9, 5, 13, 3, 11, 7, 15 };
				const int ofs = 128 - N - (i * N);
				assert(ofs >= 0 && (ofs >> 3) < 16);
				pDst_bytes[ofs >> 3] |= (s_reverse_bits4[pBlock->m_weights[i]] << (ofs & 7));
			}
			break;
		}
		case 5:
		{
			const uint32_t N = 5;
			for (int i = 0; i < total_weights; i++)
			{
				static const uint8_t s_reverse_bits5[32] = { 0, 16, 8, 24, 4, 20, 12, 28, 2, 18, 10, 26, 6, 22, 14, 30, 1, 17, 9, 25, 5, 21, 13, 29, 3, 19, 11, 27, 7, 23, 15, 31 };

				const uint32_t ofs = 128 - N - (i * N);
				const uint32_t rev = s_reverse_bits5[pBlock->m_weights[i]] << (ofs & 7);

				uint32_t index = ofs >> 3;
				assert(index < 16);
				pDst_bytes[index++] |= rev & 0xFF;
				if (index < 16)
					pDst_bytes[index++] |= (rev >> 8);
			}

			break;
		}
		default:
			assert(0);
			break;
		}

		return true;
	}